

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_constr.cc
# Opt level: O2

void __thiscall
mp::LinTerms::
unfold_from<gch::small_vector<std::pair<int,double>,256u,std::allocator<std::pair<int,double>>>>
          (LinTerms *this,
          small_vector<std::pair<int,_double>,_256U,_std::allocator<std::pair<int,_double>_>_> *vec)

{
  long lVar1;
  pair<int,_double> *v;
  ptr ppVar2;
  
  (this->coefs_).super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
  (this->vars_).super_small_vector_base<std::allocator<int>,_6U>.m_data.
  super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
  reserve(this,(vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
               super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_size);
  ppVar2 = (vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
           super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_data_ptr;
  for (lVar1 = (vec->super_small_vector_base<std::allocator<std::pair<int,_double>_>,_256U>).m_data.
               super_small_vector_data_base<std::pair<int,_double>_*,_unsigned_long>.m_size << 4;
      lVar1 != 0; lVar1 = lVar1 + -0x10) {
    add_term(this,ppVar2->second,ppVar2->first);
    ppVar2 = ppVar2 + 1;
  }
  return;
}

Assistant:

void LinTerms::unfold_from(const Vec& vec) {
  clear();
  reserve(vec.size());
  for (const auto& v: vec)
    add_term(v.second, v.first);
}